

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * __thiscall QDir::canonicalPath(QDir *this)

{
  long lVar1;
  bool bVar2;
  pointer pQVar3;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QDirPrivate *d;
  QFileSystemEntry answer;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff68;
  QFileSystemEntry *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QDir *)0x27d32d);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x27d340);
  if (bVar2) {
    pQVar3 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x27d428);
    (*pQVar3->_vptr_QAbstractFileEngine[0x19])(in_RDI,pQVar3,6);
  }
  else {
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)in_RDI,in_stack_ffffffffffffff68);
    QFileSystemEngine::canonicalName
              ((QFileSystemEntry *)&DAT_aaaaaaaaaaaaaaaa,
               (QFileSystemMetaData *)&DAT_aaaaaaaaaaaaaaaa);
    QFileSystemEntry::filePath(this_00);
    QFileSystemEntry::~QFileSystemEntry(in_RDI);
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &this_00->m_filePath;
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::canonicalPath() const
{
    Q_D(const QDir);
    if (!d->fileEngine) {
        QMutexLocker locker(&d->fileCache.mutex);
        QFileSystemEntry answer =
                QFileSystemEngine::canonicalName(d->dirEntry, d->fileCache.metaData);
        return answer.filePath();
    }
    return d->fileEngine->fileName(QAbstractFileEngine::CanonicalName);
}